

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

QItemSelection * __thiscall QItemSelectionModel::selection(QItemSelectionModel *this)

{
  long lVar1;
  QList<QItemSelectionRange> *in_RDI;
  long in_FS_OFFSET;
  QItemSelectionModelPrivate *d;
  QItemSelection *selected;
  QItemSelection *in_stack_00000088;
  QItemSelection *in_stack_00000090;
  SelectionFlags in_stack_0000010c;
  QItemSelection *in_stack_ffffffffffffffa8;
  QList<QItemSelectionRange> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  d_func((QItemSelectionModel *)0x82fbf7);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelection::QItemSelection((QItemSelection *)this_00,in_stack_ffffffffffffffa8);
  QItemSelection::merge(in_stack_00000090,in_stack_00000088,in_stack_0000010c);
  QList<QItemSelectionRange>::removeIf<(anonymous_namespace)::QtFunctionObjects::IsNotValid>(in_RDI)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QItemSelection *)this_00;
}

Assistant:

const QItemSelection QItemSelectionModel::selection() const
{
    Q_D(const QItemSelectionModel);
    QItemSelection selected = d->ranges;
    selected.merge(d->currentSelection, d->currentCommand);
    // make sure we have no invalid ranges
    // ###  should probably be handled more generic somewhere else
    selected.removeIf(QtFunctionObjects::IsNotValid());
    return selected;
}